

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O0

void fill_pipe(arm7tdmi_t *state)

{
  ushort uVar1;
  undefined4 uVar2;
  long in_RDI;
  
  if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
    uVar2 = (**(code **)(in_RDI + 0x10))(*(undefined4 *)(in_RDI + 0xb0),2);
    *(undefined4 *)(in_RDI + 0xd0) = uVar2;
    *(int *)(in_RDI + 0xb0) = *(int *)(in_RDI + 0xb0) + 4;
    uVar2 = (**(code **)(in_RDI + 0x10))(*(undefined4 *)(in_RDI + 0xb0),1);
    *(undefined4 *)(in_RDI + 0xd4) = uVar2;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] [ARM] Filling the instruction pipeline: 0x%08X = 0x%08X / 0x%08X = 0x%08X\n",
             (ulong)(*(int *)(in_RDI + 0xb0) - 4),(ulong)*(uint *)(in_RDI + 0xd0),
             (ulong)*(uint *)(in_RDI + 0xb0),(ulong)*(uint *)(in_RDI + 0xd4));
    }
  }
  else {
    uVar1 = (**(code **)(in_RDI + 8))(*(undefined4 *)(in_RDI + 0xb0),2);
    *(uint *)(in_RDI + 0xd0) = (uint)uVar1;
    *(int *)(in_RDI + 0xb0) = *(int *)(in_RDI + 0xb0) + 2;
    uVar1 = (**(code **)(in_RDI + 8))(*(undefined4 *)(in_RDI + 0xb0),1);
    *(uint *)(in_RDI + 0xd4) = (uint)uVar1;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] [THM] Filling the instruction pipeline: 0x%08X = 0x%04X / 0x%08X = 0x%04X\n",
             (ulong)(*(int *)(in_RDI + 0xb0) - 2),(ulong)*(uint *)(in_RDI + 0xd0),
             (ulong)*(uint *)(in_RDI + 0xb0),(ulong)*(uint *)(in_RDI + 0xd4));
    }
  }
  return;
}

Assistant:

void fill_pipe(arm7tdmi_t* state) {
    if (state->cpsr.thumb) {
        state->pipeline[0] = state->read_half(state->pc, ACCESS_NONSEQUENTIAL);
        state->pc += 2;
        state->pipeline[1] = state->read_half(state->pc, ACCESS_SEQUENTIAL);

        logdebug("[THM] Filling the instruction pipeline: 0x%08X = 0x%04X / 0x%08X = 0x%04X",
                 state->pc - 2,
                 state->pipeline[0],
                 state->pc,
                 state->pipeline[1])
    } else {
        state->pipeline[0] = state->read_word(state->pc, ACCESS_NONSEQUENTIAL);
        state->pc += 4;
        state->pipeline[1] = state->read_word(state->pc, ACCESS_SEQUENTIAL);

        logdebug("[ARM] Filling the instruction pipeline: 0x%08X = 0x%08X / 0x%08X = 0x%08X",
                 state->pc - 4,
                 state->pipeline[0],
                 state->pc,
                 state->pipeline[1])
    }
}